

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_NurbsSurface::SetCV(ON_NurbsSurface *this,int i,int j,ON_3dPoint *point)

{
  int iVar1;
  double *pdVar2;
  uint uVar3;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  uVar3 = j * this->m_cv_stride[1] + i * this->m_cv_stride[0];
  pdVar2 = (double *)0x0;
  if (-1 < (int)uVar3) {
    pdVar2 = this->m_cv + uVar3;
  }
  if (this->m_cv == (double *)0x0) {
    pdVar2 = (double *)0x0;
  }
  if (pdVar2 != (double *)0x0) {
    *pdVar2 = point->x;
    iVar1 = this->m_dim;
    if ((1 < (long)iVar1) && (pdVar2[1] = point->y, iVar1 != 2)) {
      pdVar2[2] = point->z;
    }
    if (this->m_is_rat != 0) {
      pdVar2[iVar1] = 1.0;
    }
  }
  return pdVar2 != (double *)0x0;
}

Assistant:

bool 
ON_NurbsSurface::SetCV( int i, int j, const ON_3dPoint& point )
{
  DestroySurfaceTree();

  bool rc = false;
  double* cv = CV(i,j);
  if ( cv ) {
    cv[0] = point.x;
    if ( m_dim > 1 ) {
      cv[1] = point.y;
      if ( m_dim > 2 )
        cv[2] = point.z;
    }
    if ( m_is_rat ) {
      cv[m_dim] = 1.0;
    }
    rc = true;
  }
  return rc;
}